

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystementry.cpp
# Opt level: O0

QString * __thiscall QFileSystemEntry::fileName(QFileSystemEntry *this)

{
  QFileSystemEntry *in_RSI;
  QString *in_RDI;
  qsizetype unaff_retaddr;
  QString *in_stack_00000008;
  QString *n;
  
  n = in_RDI;
  findLastSeparator(in_RSI);
  QString::mid(in_stack_00000008,unaff_retaddr,(qsizetype)n);
  return in_RDI;
}

Assistant:

QString QFileSystemEntry::fileName() const
{
    findLastSeparator();
#if defined(Q_OS_WIN)
    if (m_lastSeparator == -1 && m_filePath.length() >= 2 && m_filePath.at(1) == u':')
        return m_filePath.mid(2);
#endif
    return m_filePath.mid(m_lastSeparator + 1);
}